

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_stream_socket.hpp
# Opt level: O2

return_type __thiscall
asio::basic_stream_socket<asio::ip::tcp>::
async_read_some<asio::mutable_buffers_1,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,asio::ssl::detail::handshake_op,SL::WS_LITE::async_handshake(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>,std::__cxx11::string_const&,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::__0>>
          (basic_stream_socket<asio::ip::tcp> *this,mutable_buffers_1 *buffers,
          io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:114:72)>
          *handler)

{
  int iVar1;
  reactive_socket_service<asio::ip::tcp> *prVar2;
  reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:114:72)>_>
  *this_00;
  template_rebind_alloc<reactive_socket_recv_op<mutable_buffers_1,_io_op<basic_stream_socket<tcp>,_handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:114:72)>_>_>
  a;
  ptr local_48;
  
  prVar2 = (this->super_basic_socket<asio::ip::tcp>).
           super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>.
           service_;
  iVar1 = handler->start_;
  local_48.h = handler;
  this_00 = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:114:72)>_>
             *)asio_handler_allocate(0x128,&handler->handler_);
  local_48.p = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:114:72)>_>
                *)0x0;
  local_48.v = this_00;
  detail::reactive_socket_recv_op_base<asio::mutable_buffers_1>::reactive_socket_recv_op_base
            ((reactive_socket_recv_op_base<asio::mutable_buffers_1> *)this_00,
             (this->super_basic_socket<asio::ip::tcp>).
             super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>.
             implementation_.super_base_implementation_type.socket_,
             (this->super_basic_socket<asio::ip::tcp>).
             super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>.
             implementation_.super_base_implementation_type.state_,buffers,0,
             detail::
             reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/src/ClientImpl.cpp:114:72)>_>
             ::do_complete);
  ssl::detail::
  io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/src/ClientImpl.cpp:114:72)>
  ::io_op(&this_00->handler_,handler);
  local_48.p = this_00;
  detail::reactive_socket_service_base::start_op
            (&prVar2->super_reactive_socket_service_base,
             &(this->super_basic_socket<asio::ip::tcp>).
              super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>.
              implementation_.super_base_implementation_type,0,(reactor_op *)this_00,iVar1 == 0,true
             ,(bool)((buffers->super_mutable_buffer).size_ == 0 &
                    (this->super_basic_socket<asio::ip::tcp>).
                    super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>
                    .implementation_.super_base_implementation_type.state_ >> 4));
  local_48.v = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:114:72)>_>
                *)0x0;
  local_48.p = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:114:72)>_>
                *)0x0;
  detail::
  reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/src/ClientImpl.cpp:114:72)>_>
  ::ptr::~ptr(&local_48);
  return;
}

Assistant:

async_read_some(const MutableBufferSequence& buffers,
      ASIO_MOVE_ARG(ReadHandler) handler)
  {
    // If you get an error on the following line it means that your handler does
    // not meet the documented type requirements for a ReadHandler.
    ASIO_READ_HANDLER_CHECK(ReadHandler, handler) type_check;

#if defined(ASIO_ENABLE_OLD_SERVICES)
    return this->get_service().async_receive(this->get_implementation(),
        buffers, 0, ASIO_MOVE_CAST(ReadHandler)(handler));
#else // defined(ASIO_ENABLE_OLD_SERVICES)
    async_completion<ReadHandler,
      void (asio::error_code, std::size_t)> init(handler);

    this->get_service().async_receive(this->get_implementation(),
        buffers, 0, init.completion_handler);

    return init.result.get();
#endif // defined(ASIO_ENABLE_OLD_SERVICES)
  }